

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O1

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  unsigned_short uVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  int q;
  ulong uVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  
  if (this->type_from == this->type_to) {
    iVar13 = 0;
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar1 = bottom_blob->w;
      iVar2 = bottom_blob->h;
      iVar3 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar1;
      top_blob->h = iVar2;
      top_blob->c = iVar3;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    _c = bottom_blob->c;
    uVar16 = (ulong)_c;
    iVar13 = bottom_blob->dims;
    iVar1 = bottom_blob->elempack;
    sVar14 = (size_t)iVar1;
    switch(this->type_to) {
    case 1:
      sVar14 = sVar14 * 4;
      break;
    case 2:
    case 4:
      sVar14 = (size_t)(iVar1 * 2);
      break;
    case 3:
      break;
    default:
      sVar14 = bottom_blob->elemsize;
    }
    iVar2 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    if (iVar13 == 3) {
      Mat::create(top_blob,iVar2,iVar3,_c,sVar14,iVar1,opt->blob_allocator);
    }
    else if (iVar13 == 2) {
      Mat::create(top_blob,iVar2,iVar3,sVar14,iVar1,opt->blob_allocator);
    }
    else if (iVar13 == 1) {
      Mat::create(top_blob,iVar2,sVar14,iVar1,opt->blob_allocator);
    }
    iVar13 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar11 = iVar3 * iVar2 * iVar1;
      if (0 < (int)_c && (this->type_to == 2 && this->type_from == 1)) {
        uVar12 = 0;
        do {
          if (0 < (int)uVar11) {
            sVar14 = bottom_blob->elemsize;
            sVar5 = top_blob->elemsize;
            sVar6 = top_blob->cstep;
            pvVar9 = top_blob->data;
            sVar7 = bottom_blob->cstep;
            pvVar10 = bottom_blob->data;
            uVar15 = 0;
            do {
              uVar8 = float32_to_float16(*(float *)((long)pvVar10 +
                                                   uVar15 * 4 + sVar14 * sVar7 * uVar12));
              *(unsigned_short *)((long)pvVar9 + uVar15 * 2 + sVar5 * sVar6 * uVar12) = uVar8;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar16);
      }
      if (0 < (int)_c && (this->type_to == 1 && this->type_from == 2)) {
        uVar12 = 0;
        do {
          if (0 < (int)uVar11) {
            sVar14 = bottom_blob->elemsize;
            sVar5 = top_blob->elemsize;
            sVar6 = top_blob->cstep;
            pvVar9 = top_blob->data;
            sVar7 = bottom_blob->cstep;
            pvVar10 = bottom_blob->data;
            uVar15 = 0;
            do {
              fVar17 = float16_to_float32(*(unsigned_short *)
                                           ((long)pvVar10 + uVar15 * 2 + sVar14 * sVar7 * uVar12));
              *(float *)((long)pvVar9 + uVar15 * 4 + sVar5 * sVar6 * uVar12) = fVar17;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar16);
      }
      if (0 < (int)_c && (this->type_to == 1 && this->type_from == 3)) {
        pvVar9 = bottom_blob->data;
        sVar14 = bottom_blob->cstep;
        pvVar10 = top_blob->data;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->elemsize;
        uVar12 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar15 = 0;
            do {
              *(float *)((long)pvVar10 + uVar15 * 4) = (float)(int)*(char *)((long)pvVar9 + uVar15);
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          uVar12 = uVar12 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar5 * sVar6);
          pvVar9 = (void *)((long)pvVar9 + sVar14 * sVar7);
        } while (uVar12 != uVar16);
      }
      if (0 < (int)_c && (this->type_to == 4 && this->type_from == 1)) {
        pvVar9 = bottom_blob->data;
        sVar14 = bottom_blob->cstep;
        pvVar10 = top_blob->data;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->elemsize;
        uVar12 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar15 = 0;
            do {
              *(undefined2 *)((long)pvVar10 + uVar15 * 2) =
                   *(undefined2 *)((long)pvVar9 + uVar15 * 4 + 2);
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          uVar12 = uVar12 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar5 * sVar6);
          pvVar9 = (void *)((long)pvVar9 + sVar14 * sVar7);
        } while (uVar12 != uVar16);
      }
      if (0 < (int)_c && (this->type_to == 1 && this->type_from == 4)) {
        pvVar9 = bottom_blob->data;
        sVar14 = bottom_blob->cstep;
        pvVar10 = top_blob->data;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->elemsize;
        uVar12 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar15 = 0;
            do {
              *(uint *)((long)pvVar10 + uVar15 * 4) =
                   (uint)*(ushort *)((long)pvVar9 + uVar15 * 2) << 0x10;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          uVar12 = uVar12 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar5 * sVar6);
          pvVar9 = (void *)((long)pvVar9 + sVar14 * sVar7);
        } while (uVar12 != uVar16);
      }
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_bfloat16(ptr[i]);
            }
        }
    }

    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = bfloat16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}